

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

void __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::get_all_timers(timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                 *this,op_queue<boost::asio::detail::scheduler_operation> *ops)

{
  per_timer_data *ppVar1;
  wait_op *pwVar2;
  pointer phVar3;
  scheduler_operation *psVar4;
  
  ppVar1 = this->timers_;
  while (ppVar1 != (per_timer_data *)0x0) {
    this->timers_ = ppVar1->next_;
    pwVar2 = (ppVar1->op_queue_).front_;
    if (pwVar2 != (wait_op *)0x0) {
      psVar4 = ops->back_;
      if (ops->back_ == (scheduler_operation *)0x0) {
        psVar4 = (scheduler_operation *)ops;
      }
      psVar4->next_ = &pwVar2->super_operation;
      ops->back_ = &((ppVar1->op_queue_).back_)->super_operation;
      (ppVar1->op_queue_).front_ = (wait_op *)0x0;
      (ppVar1->op_queue_).back_ = (wait_op *)0x0;
    }
    ppVar1->next_ = (per_timer_data *)0x0;
    ppVar1->prev_ = (per_timer_data *)0x0;
    ppVar1 = this->timers_;
  }
  phVar3 = (this->heap_).
           super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->heap_).
      super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != phVar3) {
    (this->heap_).
    super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = phVar3;
  }
  return;
}

Assistant:

virtual void get_all_timers(op_queue<operation>& ops)
  {
    while (timers_)
    {
      per_timer_data* timer = timers_;
      timers_ = timers_->next_;
      ops.push(timer->op_queue_);
      timer->next_ = 0;
      timer->prev_ = 0;
    }

    heap_.clear();
  }